

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<unsigned_int>::loadFromIterator<Kernel::FormulaVarIterator>
          (Stack<unsigned_int> *this,FormulaVarIterator *it)

{
  bool bVar1;
  uint uVar2;
  uint *puVar3;
  
  while( true ) {
    bVar1 = Kernel::FormulaVarIterator::hasNext(it);
    if (!bVar1) break;
    uVar2 = Kernel::FormulaVarIterator::next(it);
    puVar3 = this->_cursor;
    if (puVar3 == this->_end) {
      expand(this);
      puVar3 = this->_cursor;
    }
    *puVar3 = uVar2;
    this->_cursor = puVar3 + 1;
  }
  return;
}

Assistant:

void loadFromIterator(It it) {
    // TODO check iterator.size() or iterator.sizeHint()
    while(it.hasNext()) {
      push(it.next());
    }
  }